

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QSaveFileLineEdit.cpp
# Opt level: O2

void __thiscall QSaveFileLineEditPrivate::~QSaveFileLineEditPrivate(QSaveFileLineEditPrivate *this)

{
  QObject::~QObject(&this->super_QObject);
  operator_delete(this,0x28);
  return;
}

Assistant:

class QSaveFileLineEditPrivate : public QObject {
    Q_OBJECT

public:
    explicit QSaveFileLineEditPrivate(QSaveFileLineEdit *widgetP)
        : QObject(widgetP)
        , widget(widgetP)
        , action(new QFileAction(this)) {
        Q_ASSERT(widget);

        action->setType(QFileAction::Type::SaveFile);
        widget->addAction(action, position);

        connect(widget, &QLineEdit::textChanged, this, &QSaveFileLineEditPrivate::textChanged);
        connect(action, &QFileAction::filePathChanged, this, &QSaveFileLineEditPrivate::filePathChanged);
        connect(action, &QFileAction::filePathChanged, widget, &QSaveFileLineEdit::filePathChanged);
    }

    void textChanged(const QString &text) {
        action->setFilePath(text);
    }